

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O1

void __thiscall
so_5::timers_details::
actual_manager_t<timertt::timer_wheel_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::schedule_anonymous
          (actual_manager_t<timertt::timer_wheel_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,type_index *type_index,mbox_t *mbox,message_ref_t *msg,duration pause,
          duration period)

{
  atomic_refcounted_t *paVar1;
  basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
  *this_00;
  anon_class_32_4_6b32a2d3 local_58;
  _Any_data local_38;
  code *local_28;
  
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
             *)(this->m_manager)._M_t.
               super___uniq_ptr_impl<timertt::timer_wheel_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_wheel_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_timertt::timer_wheel_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_*,_std::default_delete<timertt::timer_wheel_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
               .
               super__Head_base<0UL,_timertt::timer_wheel_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_*,_false>
               ._M_head_impl;
  local_58.type_index = (type_index)type_index->_M_target;
  local_58.mbox = (mbox_t)mbox->m_obj;
  if (local_58.mbox.m_obj != (abstract_message_box_t *)0x0) {
    LOCK();
    ((local_58.mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         ((local_58.mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  local_58.msg = (message_ref_t)msg->m_obj;
  if (local_58.msg.m_obj != (message_t *)0x0) {
    LOCK();
    ((local_58.msg.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         ((local_58.msg.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  local_58.this = this;
  std::function<void()>::
  function<so_5::timers_details::actual_manager_t<timertt::timer_wheel_manager_template<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>::schedule_anonymous(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_,void>
            ((function<void()> *)local_38._M_pod_data,&local_58);
  timertt::details::
  basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
  ::
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this_00,(duration<long,_std::ratio<1L,_1000000000L>_>)pause.__r,
             (duration<long,_std::ratio<1L,_1000000000L>_>)period.__r,(timer_action *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_58.msg.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_58.msg.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_58.msg.m_obj != (message_t *)0x0)) {
      (*(local_58.msg.m_obj)->_vptr_message_t[1])();
    }
    local_58.msg.m_obj = (message_t *)0x0;
  }
  if (local_58.mbox.m_obj != (abstract_message_box_t *)0x0) {
    LOCK();
    paVar1 = &(local_58.mbox.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_58.mbox.m_obj != (abstract_message_box_t *)0x0)) {
      (*(local_58.mbox.m_obj)->_vptr_abstract_message_box_t[1])();
    }
  }
  return;
}

Assistant:

virtual void
		schedule_anonymous(
			const std::type_index & type_index,
			const mbox_t & mbox,
			const message_ref_t & msg,
			std::chrono::steady_clock::duration pause,
			std::chrono::steady_clock::duration period ) override
			{
				m_manager->activate(
						pause,
						period,
						[this, type_index, mbox, msg]()
						{
							m_collector.get().accept( type_index, mbox, msg );
						} );
			}